

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O1

ClausePtr __thiscall Satyricon::SATSolver::propagation(SATSolver *this)

{
  pointer *ppWVar1;
  size_type sVar2;
  pointer pLVar3;
  pointer pWVar4;
  pointer pvVar5;
  Watcher WVar6;
  iterator iVar7;
  pointer pWVar8;
  pointer pWVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  ostream *poVar13;
  literal_value lVar14;
  long lVar15;
  vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>> *pvVar16;
  literal_value lVar17;
  uint uVar18;
  ulong uVar19;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *__args;
  bool bVar20;
  string local_58;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 local_38;
  
  do {
    if ((ulong)((long)(this->trail).
                      super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->trail).
                      super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <=
        this->propagation_starting_pos) {
      return (ClausePtr)0x0;
    }
    if (1 < this->log_level) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"propagate ",10);
      Literal::print_abi_cxx11_
                (&local_58,
                 (this->trail).
                 super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl
                 .super__Vector_impl_data._M_start + this->propagation_starting_pos);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length
                          );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
    }
    sVar2 = this->propagation_starting_pos;
    pLVar3 = (this->trail).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->propagation_starting_pos = sVar2 + 1;
    uVar18 = pLVar3[sVar2].value;
    pWVar4 = (this->propagation_to_move).
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->propagation_to_move).
        super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
        ._M_impl.super__Vector_impl_data._M_finish != pWVar4) {
      (this->propagation_to_move).
      super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
      ._M_impl.super__Vector_impl_data._M_finish = pWVar4;
    }
    uVar19 = (ulong)uVar18 ^ 1;
    pvVar5 = (this->watch_list).
             super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pWVar8 = (this->propagation_to_move).
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pWVar9 = (this->propagation_to_move).
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->propagation_to_move).
    super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
    ._M_impl.super__Vector_impl_data._M_start =
         pvVar5[uVar19].
         super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->propagation_to_move).
    super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)
          ((long)&pvVar5[uVar19].
                  super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                  ._M_impl.super__Vector_impl_data + 8);
    (this->propagation_to_move).
    super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          ((long)&pvVar5[uVar19].
                  super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                  ._M_impl.super__Vector_impl_data + 0x10);
    pvVar5[uVar19].
    super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
    ._M_impl.super__Vector_impl_data._M_start = pWVar4;
    ppWVar1 = (pointer *)
              ((long)&pvVar5[uVar19].
                      super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                      ._M_impl.super__Vector_impl_data + 8);
    *ppWVar1 = pWVar8;
    ppWVar1[1] = pWVar9;
    for (__args = &((this->propagation_to_move).
                    super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_0;
        bVar20 = __args != &((this->propagation_to_move).
                             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->field_0, bVar20;
        __args = __args + 1) {
      WVar6.field_0 = (anon_union_8_2_f7e3ed0a_for_Watcher_0)__args->bits;
      uVar18 = (uint)uVar19;
      if (*(uint *)((long)WVar6.field_0 + 8) == uVar18) {
LAB_001123ab:
        *(uint *)((long)WVar6.field_0 + 8) = *(uint *)((long)WVar6.field_0 + 0xc);
        *(uint *)((long)WVar6.field_0 + 0xc) = uVar18;
      }
      else {
        if (*(uint *)((long)WVar6.field_0 + 0xc) != uVar18) {
          __assert_fail("c[0]==failed || c[1]==failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                        ,0x14f,"SATSolver::ClausePtr Satyricon::SATSolver::propagation()");
        }
        if (*(uint *)((long)WVar6.field_0 + 8) == uVar18) goto LAB_001123ab;
      }
      uVar12 = *(uint *)((long)WVar6.field_0 + 8) >> 1;
      if ((*(uint *)((long)WVar6.field_0 + 8) & 1) == 0) {
        lVar14 = (this->values).
                 super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12];
      }
      else {
        lVar14 = LIT_TRUE -
                 (this->values).
                 super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12];
      }
      if (lVar14 == LIT_TRUE) {
        pvVar16 = (vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>
                   *)((this->watch_list).
                      super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
LAB_0011252f:
        iVar7._M_current = *(Watcher **)(pvVar16 + 8);
        if (iVar7._M_current == *(Watcher **)(pvVar16 + 0x10)) {
          std::vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>::
          _M_realloc_insert<Satyricon::SATSolver::Watcher_const&>(pvVar16,iVar7,(Watcher *)__args);
        }
        else {
          ((iVar7._M_current)->field_0).clause = (ClausePtr)*(ClausePtr *)__args;
          *(long *)(pvVar16 + 8) = *(long *)(pvVar16 + 8) + 8;
        }
        bVar10 = true;
      }
      else {
        if (*(uint *)WVar6.field_0 >> 1 != 2) {
          lVar15 = 0;
          do {
            uVar12 = *(uint *)((long)WVar6.field_0 + (lVar15 + 4) * 4);
            lVar14 = (this->values).
                     super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12 >> 1];
            lVar17 = LIT_TRUE - lVar14;
            if ((uVar12 & 1) == 0) {
              lVar17 = lVar14;
            }
            if (lVar17 != LIT_FALSE) {
              *(uint *)((long)WVar6.field_0 + 0xc) = uVar12;
              *(uint *)((long)WVar6.field_0 + (lVar15 + 4) * 4) = uVar18;
              pvVar16 = (vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>
                         *)((this->watch_list).
                            super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                           *(uint *)((long)WVar6.field_0 + 0xc));
              goto LAB_0011252f;
            }
            lVar15 = lVar15 + 1;
          } while ((ulong)(*(uint *)WVar6.field_0 >> 1) - 2 != lVar15);
        }
        pvVar16 = (vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>
                   *)((this->watch_list).
                      super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        iVar7._M_current = *(Watcher **)(pvVar16 + 8);
        if (iVar7._M_current == *(Watcher **)(pvVar16 + 0x10)) {
          std::vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>::
          _M_realloc_insert<Satyricon::SATSolver::Watcher_const&>(pvVar16,iVar7,(Watcher *)__args);
        }
        else {
          ((iVar7._M_current)->field_0).clause = (ClausePtr)*(ClausePtr *)__args;
          *(long *)(pvVar16 + 8) = *(long *)(pvVar16 + 8) + 8;
        }
        bVar11 = assign(this,(Literal)*(uint *)((long)WVar6.field_0 + 8),__args->clause);
        bVar10 = true;
        if (bVar11) {
          if (1 < this->log_level) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\tfound a conflict on ",0x15);
            Clause::print_abi_cxx11_(&local_58,__args->clause);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_58._M_dataplus._M_p,
                                 local_58._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          local_38.clause = *(ClausePtr *)__args;
          __args = __args + 1;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<Satyricon::SATSolver::Watcher*,std::back_insert_iterator<std::vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>>>
                    ((Watcher *)__args,
                     (this->propagation_to_move).
                     super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (this->watch_list).
                     super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar19);
          bVar10 = false;
        }
      }
      if (!bVar10) break;
    }
    if (bVar20) {
      return local_38.clause;
    }
  } while( true );
}

Assistant:

SATSolver::ClausePtr SATSolver::propagation() {

    while ( propagation_starting_pos < trail.size() ) {

        PRINT_VERBOSE("propagate " << trail[propagation_starting_pos] << endl);

        // extract the list of the opposite literal 
        // (they are false now, their watcher must be moved)
        auto failed = !trail[propagation_starting_pos++];
        propagation_to_move.clear();
        swap(propagation_to_move,watch_list[failed.index()]);

        for (auto it = propagation_to_move.begin();
                it != propagation_to_move.end(); ++it) {

            // propagate effect on a clause
            Clause &c = *(it->get_clause()); // usefull reference
            assert(c[0]==failed || c[1]==failed);

            // make sure the false literal is in position 1
            if ( c[0] == failed ) { c[0] = c[1]; c[1] = failed; }

            // if the clause is already solved, nothing need to be moved
            if (get_asigned_value(c[0]) == LIT_TRUE) {
                // reinsert inside the previous watch list
                watch_list[failed.index()].push_back(*it);
                continue; // move to the next
            }

            // search a new literal to watch
            bool foundt_new_watch = false;
            for ( size_t pos = 2; pos != c.size(); ++pos) {
                if ( get_asigned_value(c[pos]) != LIT_FALSE ) {
                    // swap value
                    c[1] = c[pos]; c[pos] = failed;
                    // insert in the new watch list
                    watch_list[c[1].index()].push_back(*it);
                    // move to the next
                    foundt_new_watch = true;
                    break;
                }
            }
            if ( foundt_new_watch ) continue; // move to the next

            // no new literal to watch, reinsert in the old position
            watch_list[failed.index()].push_back(*it);

            // the clause must be a conflict or a unit, try to assign the value
            bool conflict = assign(c[0],it->get_clause());
            if ( ! conflict ) continue; // no problem, move to the next

            // conflict found in propagation 
            PRINT_VERBOSE("\tfound a conflict on " << (it->get_clause())->print() << endl);
            ClausePtr conflict_clause = it->get_clause();

            // reset the other literal to move (it is already set by propagate)
            copy(++it, propagation_to_move.end(),
                    back_inserter(watch_list[failed.index()]));

            return conflict_clause;
        }
    }
    return nullptr; // no conflict
}